

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

QJsonValue * QJsonValue::fromVariant(QVariant *variant)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  qulonglong qVar4;
  ulong uVar5;
  QJsonValue *in_RDI;
  long in_FS_OFFSET;
  double v;
  QString string;
  QJsonDocument doc;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  QCborValue *in_stack_fffffffffffffe00;
  QVariant *in_stack_fffffffffffffe08;
  QCborMap *this;
  QVariant *in_stack_fffffffffffffe10;
  QJsonValue *this_00;
  QJsonDocument *in_stack_fffffffffffffe18;
  QUuid *in_stack_fffffffffffffe20;
  Type TVar6;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  QVariant *in_stack_fffffffffffffe38;
  QCborValue *in_stack_fffffffffffffe40;
  QVariantHash *in_stack_fffffffffffffe58;
  QCborMap local_138;
  QUrl *in_stack_fffffffffffffed0;
  QJsonValue local_128;
  undefined1 *local_108;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_d4 [16];
  FormattingOptions in_stack_ffffffffffffff6c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QVariant::metaType((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  iVar3 = QMetaType::id((QMetaType *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  switch(iVar3) {
  case 1:
    ::QVariant::toBool(in_stack_fffffffffffffe10);
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe00,
               SUB41((uint)in_stack_fffffffffffffdfc >> 0x18,0));
    break;
  case 2:
  case 3:
  case 4:
  case 0x20:
  case 0x21:
  case 0x24:
    ::QVariant::toLongLong
              ((QVariant *)in_stack_fffffffffffffe00,
               (bool *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe00,
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    break;
  case 5:
  case 0x23:
    qVar4 = ::QVariant::toULongLong
                      ((QVariant *)in_stack_fffffffffffffe00,
                       (bool *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    uVar5 = std::numeric_limits<long_long>::max();
    if (qVar4 <= uVar5) {
      ::QVariant::toLongLong
                ((QVariant *)in_stack_fffffffffffffe00,
                 (bool *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      QJsonValue((QJsonValue *)in_stack_fffffffffffffe00,
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      break;
    }
  case 6:
  case 0x26:
  case 0x3f:
    TVar6 = (Type)((ulong)in_stack_fffffffffffffe20 >> 0x20);
    ::QVariant::toDouble
              ((QVariant *)in_stack_fffffffffffffe00,
               (bool *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    bVar2 = qt_is_finite(2.39573913865358e-317);
    if (bVar2) {
      QJsonValue((QJsonValue *)in_stack_fffffffffffffe00,
                 (double)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
    else {
      QJsonValue((QJsonValue *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),TVar6);
    }
    break;
  default:
    ::QVariant::toString((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    TVar6 = (Type)((ulong)in_stack_fffffffffffffe20 >> 0x20);
    bVar2 = QString::isEmpty((QString *)0x4a0541);
    if (bVar2) {
      QJsonValue((QJsonValue *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),TVar6);
    }
    else {
      QJsonValue((QJsonValue *)in_stack_fffffffffffffe00,
                 (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
    QString::~QString((QString *)0x4a05b5);
    break;
  case 8:
    ::QVariant::toMap((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QJsonObject::fromVariantMap
              ((QVariantMap *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe10,(QJsonObject *)in_stack_fffffffffffffe08);
    QJsonObject::~QJsonObject((QJsonObject *)0x49ff78);
    QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x49ff85);
    break;
  case 9:
    ::QVariant::toList((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QJsonArray::fromVariantList
              ((QVariantList *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe10,(QJsonArray *)in_stack_fffffffffffffe08);
    QJsonArray::~QJsonArray((QJsonArray *)0x49feef);
    QList<QVariant>::~QList((QList<QVariant> *)0x49fefc);
    break;
  case 10:
    ::QVariant::toString((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe00,
               (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QString::~QString((QString *)0x49fdea);
    break;
  case 0xb:
    ::QVariant::toStringList
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QJsonArray::fromStringList((QStringList *)in_stack_fffffffffffffe40);
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe10,(QJsonArray *)in_stack_fffffffffffffe08);
    QJsonArray::~QJsonArray((QJsonArray *)0x49fe66);
    QList<QString>::~QList((QList<QString> *)0x49fe73);
    break;
  case 0x11:
    ::QVariant::toUrl((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              (local_d4,FullyEncoded);
    QUrl::toString(in_stack_fffffffffffffed0,in_stack_ffffffffffffff6c);
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe00,
               (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QString::~QString((QString *)0x4a00a5);
    QUrl::~QUrl((QUrl *)in_stack_fffffffffffffe00);
    break;
  case 0x1c:
    ::QVariant::toHash((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QJsonObject::fromVariantHash(in_stack_fffffffffffffe58);
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe10,(QJsonObject *)in_stack_fffffffffffffe08);
    QJsonObject::~QJsonObject((QJsonObject *)0x4a0001);
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)in_stack_fffffffffffffe00);
    break;
  case 0x1e:
    ::QVariant::toUuid(in_stack_fffffffffffffe08);
    QUuid::toString(in_stack_fffffffffffffe20,
                    (StringFormat)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe00,
               (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QString::~QString((QString *)0x4a0162);
    break;
  case 0x2d:
    ::QVariant::toJsonValue
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    break;
  case 0x2e:
    ::QVariant::toJsonObject
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe10,(QJsonObject *)in_stack_fffffffffffffe08);
    QJsonObject::~QJsonObject((QJsonObject *)0x4a01dc);
    break;
  case 0x2f:
    ::QVariant::toJsonArray
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe10,(QJsonArray *)in_stack_fffffffffffffe08);
    QJsonArray::~QJsonArray((QJsonArray *)0x4a0215);
    break;
  case 0x30:
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toJsonDocument
              ((QVariant *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    bVar2 = QJsonDocument::isArray
                      ((QJsonDocument *)
                       CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    if (bVar2) {
      QJsonDocument::array(in_stack_fffffffffffffe18);
      QJsonValue((QJsonValue *)in_stack_fffffffffffffe10,(QJsonArray *)in_stack_fffffffffffffe08);
      QJsonArray::~QJsonArray((QJsonArray *)0x4a0306);
    }
    else {
      QJsonDocument::object(in_stack_fffffffffffffe18);
      QJsonValue((QJsonValue *)in_stack_fffffffffffffe10,(QJsonObject *)in_stack_fffffffffffffe08);
      QJsonObject::~QJsonObject((QJsonObject *)0x4a02ed);
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)0x4a0313);
    break;
  case 0x33:
    QJsonValue((QJsonValue *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
               (Type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    break;
  case 0x35:
    qvariant_cast<QCborValue>(in_stack_fffffffffffffe38);
    ::QCborValue::toJsonValue(in_stack_fffffffffffffe40);
    ::QCborValue::~QCborValue(in_stack_fffffffffffffe00);
    break;
  case 0x36:
    this_00 = &local_128;
    qvariant_cast<QCborArray>(in_stack_fffffffffffffe38);
    QCborArray::toJsonArray((QCborArray *)in_stack_fffffffffffffe08);
    QJsonValue(this_00,(QJsonArray *)in_stack_fffffffffffffe08);
    QJsonArray::~QJsonArray((QJsonArray *)0x4a042b);
    QCborArray::~QCborArray((QCborArray *)0x4a0438);
    break;
  case 0x37:
    this = &local_138;
    qvariant_cast<QCborMap>(in_stack_fffffffffffffe38);
    QCborMap::toJsonObject(this);
    QJsonValue((QJsonValue *)in_stack_fffffffffffffe10,(QJsonObject *)this);
    QJsonObject::~QJsonObject((QJsonObject *)0x4a04b4);
    QCborMap::~QCborMap((QCborMap *)0x4a04c1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QJsonValue QJsonValue::fromVariant(const QVariant &variant)
{
    switch (variant.metaType().id()) {
    case QMetaType::Nullptr:
        return QJsonValue(Null);
    case QMetaType::Bool:
        return QJsonValue(variant.toBool());
    case QMetaType::Short:
    case QMetaType::UShort:
    case QMetaType::Int:
    case QMetaType::UInt:
    case QMetaType::Long:
    case QMetaType::LongLong:
        return QJsonValue(variant.toLongLong());
    case QMetaType::ULong:
    case QMetaType::ULongLong:
        if (variant.toULongLong() <= static_cast<uint64_t>(std::numeric_limits<qint64>::max()))
            return QJsonValue(variant.toLongLong());
        Q_FALLTHROUGH();
    case QMetaType::Float16:
    case QMetaType::Float:
    case QMetaType::Double: {
        double v = variant.toDouble();
        return qt_is_finite(v) ? QJsonValue(v) : QJsonValue();
    }
    case QMetaType::QString:
        return QJsonValue(variant.toString());
    case QMetaType::QStringList:
        return QJsonValue(QJsonArray::fromStringList(variant.toStringList()));
    case QMetaType::QVariantList:
        return QJsonValue(QJsonArray::fromVariantList(variant.toList()));
    case QMetaType::QVariantMap:
        return QJsonValue(QJsonObject::fromVariantMap(variant.toMap()));
    case QMetaType::QVariantHash:
        return QJsonValue(QJsonObject::fromVariantHash(variant.toHash()));
#ifndef QT_BOOTSTRAPPED
    case QMetaType::QUrl:
        return QJsonValue(variant.toUrl().toString(QUrl::FullyEncoded));
    case QMetaType::QUuid:
        return variant.toUuid().toString(QUuid::WithoutBraces);
    case QMetaType::QJsonValue:
        return variant.toJsonValue();
    case QMetaType::QJsonObject:
        return variant.toJsonObject();
    case QMetaType::QJsonArray:
        return variant.toJsonArray();
    case QMetaType::QJsonDocument: {
        QJsonDocument doc = variant.toJsonDocument();
        return doc.isArray() ? QJsonValue(doc.array()) : QJsonValue(doc.object());
    }
    case QMetaType::QCborValue:
        return qvariant_cast<QCborValue>(variant).toJsonValue();
    case QMetaType::QCborArray:
        return qvariant_cast<QCborArray>(variant).toJsonArray();
    case QMetaType::QCborMap:
        return qvariant_cast<QCborMap>(variant).toJsonObject();
#endif
    default:
        break;
    }
    QString string = variant.toString();
    if (string.isEmpty())
        return QJsonValue();
    return QJsonValue(string);
}